

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

void __thiscall gl3cts::ClipDistance::Utility::Program::~Program(Program *this)

{
  Program *this_local;
  
  if ((this->m_vertex_shader_status).shader_id != 0) {
    (*this->m_gl->deleteShader)((this->m_vertex_shader_status).shader_id);
    (this->m_vertex_shader_status).shader_id = 0;
  }
  if ((this->m_fragment_shader_status).shader_id != 0) {
    (*this->m_gl->deleteShader)((this->m_fragment_shader_status).shader_id);
    (this->m_fragment_shader_status).shader_id = 0;
  }
  if ((this->m_program_status).program_id != 0) {
    (*this->m_gl->deleteProgram)((this->m_program_status).program_id);
    (this->m_program_status).program_id = 0;
  }
  LinkageStatus::~LinkageStatus(&this->m_program_status);
  CompilationStatus::~CompilationStatus(&this->m_fragment_shader_status);
  CompilationStatus::~CompilationStatus(&this->m_vertex_shader_status);
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::~Program()
{
	if (m_vertex_shader_status.shader_id)
	{
		m_gl.deleteShader(m_vertex_shader_status.shader_id);

		m_vertex_shader_status.shader_id = 0;
	}

	if (m_fragment_shader_status.shader_id)
	{
		m_gl.deleteShader(m_fragment_shader_status.shader_id);

		m_fragment_shader_status.shader_id = 0;
	}

	if (m_program_status.program_id)
	{
		m_gl.deleteProgram(m_program_status.program_id);

		m_program_status.program_id = 0;
	}
}